

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

LightLeSample * __thiscall
pbrt::SpotLight::SampleLe
          (SpotLight *this,Point2f *u1,Point2f *u2,SampledWavelengths *lambda,Float time)

{
  span<const_float> weights;
  int iVar1;
  SampledWavelengths *lambda_00;
  Tuple2<pbrt::Point2,_float> *in_RCX;
  Tuple2<pbrt::Point2,_float> *in_RDX;
  long in_RSI;
  LightLeSample *in_RDI;
  Float in_XMM0_Da;
  Float FVar2;
  undefined1 auVar8 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 extraout_var [56];
  undefined1 auVar7 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  Vector3f VVar13;
  SampledSpectrum SVar14;
  Ray ray;
  Float phi;
  Float sinTheta;
  Float cosTheta;
  Float pdfDir;
  int section;
  Vector3f wl;
  Float sectionPDF;
  Float p [2];
  Float in_stack_fffffffffffffe68;
  Float in_stack_fffffffffffffe6c;
  Float x;
  span<const_float> *in_stack_fffffffffffffe70;
  Ray *ray_00;
  undefined4 in_stack_fffffffffffffe78;
  LightLeSample *this_00;
  undefined8 in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  Ray *this_01;
  Float in_stack_fffffffffffffe98;
  Float in_stack_fffffffffffffe9c;
  Point2f *in_stack_fffffffffffffea0;
  LightLeSample *fmt;
  Float *in_stack_fffffffffffffec8;
  Float *in_stack_fffffffffffffed0;
  LogLevel level;
  undefined8 in_stack_fffffffffffffed8;
  Float u;
  float *in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffee8;
  undefined1 local_fc [68];
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  undefined1 auVar12 [56];
  
  FVar2 = (Float)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  u = (Float)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  fmt = in_RDI;
  Vector3<float>::Vector3((Vector3<float> *)0x6ff88d);
  pstd::span<float_const>::span<2ul>
            (in_stack_fffffffffffffe70,
             (float (*) [2])CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  x = SUB84(in_stack_fffffffffffffe70,0);
  Tuple2<pbrt::Point2,_float>::operator[](in_RCX,0);
  weights.n = in_stack_fffffffffffffee8;
  weights.ptr = in_stack_fffffffffffffee0;
  iVar1 = SampleDiscrete(weights,u,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  level = (LogLevel)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  if (iVar1 == 0) {
    auVar8 = (undefined1  [56])0x0;
    VVar13 = SampleUniformCone(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    auVar3._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar3._8_56_ = auVar8;
    vmovlpd_avx(auVar3._0_16_);
    UniformConePDF(*(Float *)(in_RSI + 0xc4));
  }
  else {
    Tuple2<pbrt::Point2,_float>::operator[](in_RDX,0);
    FVar2 = SampleSmoothStep((Float)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                             (Float)in_stack_fffffffffffffe90,FVar2);
    if ((FVar2 < *(float *)(in_RSI + 200)) || (*(float *)(in_RSI + 0xc4) < FVar2)) {
      LogFatal<char_const(&)[57]>
                (level,(char *)in_stack_fffffffffffffec8,(int)((ulong)in_RSI >> 0x20),(char *)fmt,
                 (char (*) [57])in_RDI);
    }
    vfnmadd213ss_fma(ZEXT416((uint)FVar2),ZEXT416((uint)FVar2),SUB6416(ZEXT464(0x3f800000),0));
    SafeSqrt(0.0);
    Tuple2<pbrt::Point2,_float>::operator[](in_RDX,1);
    auVar8 = (undefined1  [56])0x0;
    VVar13 = SphericalDirection(in_stack_fffffffffffffe98,
                                (Float)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                                (Float)in_stack_fffffffffffffe90);
    auVar4._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar4._8_56_ = auVar8;
    vmovlpd_avx(auVar4._0_16_);
    SmoothStepPDF(x,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
  }
  lambda_00 = (SampledWavelengths *)(in_RSI + 0x18);
  ray_00 = (Ray *)local_fc;
  auVar12 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  Point3<float>::Point3
            ((Point3<float> *)ray_00,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68,0.0);
  this_00 = (LightLeSample *)&stack0xfffffffffffffef8;
  MediumHandle::MediumHandle
            ((MediumHandle *)ray_00,
             (MediumHandle *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  this_01 = (Ray *)(local_fc + 0xc);
  Ray::Ray(this_01,(Point3f *)lambda_00,(Vector3f *)this_00,in_XMM0_Da,(MediumHandle *)ray_00);
  Transform::operator()
            ((Transform *)in_stack_ffffffffffffff58,(Ray *)in_stack_ffffffffffffff50,
             (Float *)in_stack_ffffffffffffff48);
  auVar8 = (undefined1  [56])0x0;
  SVar14 = DenselySampledSpectrum::Sample((DenselySampledSpectrum *)this_01,lambda_00);
  auVar9._0_8_ = SVar14.values.values._8_8_;
  auVar9._8_56_ = auVar12;
  auVar5._0_8_ = SVar14.values.values._0_8_;
  auVar5._8_56_ = auVar8;
  auVar8 = (undefined1  [56])0x0;
  vmovlpd_avx(auVar5._0_16_);
  vmovlpd_avx(auVar9._0_16_);
  SVar14 = pbrt::operator*((Float)((ulong)ray_00 >> 0x20),
                           (SampledSpectrum *)
                           CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  auVar10._0_8_ = SVar14.values.values._8_8_;
  auVar10._8_56_ = auVar12;
  auVar6._0_8_ = SVar14.values.values._0_8_;
  auVar6._8_56_ = auVar8;
  vmovlpd_avx(auVar6._0_16_);
  vmovlpd_avx(auVar10._0_16_);
  Falloff((SpotLight *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffe78),(Vector3f *)ray_00);
  auVar8 = extraout_var;
  SVar14 = SampledSpectrum::operator*((SampledSpectrum *)ray_00,in_stack_fffffffffffffe6c);
  auVar11._0_8_ = SVar14.values.values._8_8_;
  auVar11._8_56_ = auVar12;
  auVar7._0_8_ = SVar14.values.values._0_8_;
  auVar7._8_56_ = auVar8;
  vmovlpd_avx(auVar7._0_16_);
  vmovlpd_avx(auVar11._0_16_);
  LightLeSample::LightLeSample
            (this_00,(SampledSpectrum *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffe78),ray_00,
             in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
  return fmt;
}

Assistant:

LightLeSample SpotLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                  SampledWavelengths &lambda, Float time) const {
    // Unnormalized probabilities of sampling each part.
    Float p[2] = {1 - cosFalloffStart, (cosFalloffStart - cosFalloffEnd) / 2};
    Float sectionPDF;
    Vector3f wl;
    int section = SampleDiscrete(p, u2[0], &sectionPDF);
    Float pdfDir;
    if (section == 0) {
        // Sample center cone
        wl = SampleUniformCone(u1, cosFalloffStart);
        pdfDir = sectionPDF * UniformConePDF(cosFalloffStart);
    } else {
        DCHECK_EQ(1, section);

        Float cosTheta = SampleSmoothStep(u1[0], cosFalloffEnd, cosFalloffStart);
        CHECK(cosTheta >= cosFalloffEnd && cosTheta <= cosFalloffStart);
        Float sinTheta = SafeSqrt(1 - cosTheta * cosTheta);
        Float phi = u1[1] * 2 * Pi;
        wl = SphericalDirection(sinTheta, cosTheta, phi);
        pdfDir = sectionPDF * SmoothStepPDF(cosTheta, cosFalloffEnd, cosFalloffStart) /
                 (2 * Pi);
    }

    Ray ray = renderFromLight(Ray(Point3f(0, 0, 0), wl, time, mediumInterface.outside));
    return LightLeSample(scale * I.Sample(lambda) * Falloff(wl), ray, 1, pdfDir);
}